

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

Gia_Man_t * Gia_ManPerformMappingInt(Gia_Man_t *p,If_Par_t *pPars)

{
  char cVar1;
  If_Par_t *pIVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  If_Man_t *pIfMan;
  If_DsdMan_t *pIVar6;
  Tim_Man_t *pTVar7;
  void *pvVar8;
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar9;
  char *pcVar10;
  uint fUnitDelay;
  long lVar11;
  
  if (pPars->pTimesArr != (float *)0x0) {
    __assert_fail("pPars->pTimesArr == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x8d9,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  if (pPars->pTimesReq != (float *)0x0) {
    __assert_fail("pPars->pTimesReq == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x8da,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  pVVar9 = p->vCiArrs;
  if (pVVar9 != (Vec_Int_t *)0x0) {
    iVar3 = pVVar9->nSize;
    if (iVar3 != p->vCis->nSize) {
      __assert_fail("Vec_IntSize(p->vCiArrs) == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x8dd,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    pfVar5 = (float *)calloc((long)iVar3,4);
    pPars->pTimesArr = pfVar5;
    for (lVar11 = 0; lVar11 < iVar3; lVar11 = lVar11 + 1) {
      iVar3 = Vec_IntEntry(pVVar9,(int)lVar11);
      pPars->pTimesArr[lVar11] = (float)iVar3;
      pVVar9 = p->vCiArrs;
      iVar3 = pVVar9->nSize;
    }
  }
  pVVar9 = p->vCoReqs;
  if (pVVar9 != (Vec_Int_t *)0x0) {
    iVar3 = pVVar9->nSize;
    if (iVar3 != p->vCos->nSize) {
      __assert_fail("Vec_IntSize(p->vCoReqs) == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x8ed,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    pfVar5 = (float *)calloc((long)iVar3,4);
    pPars->pTimesReq = pfVar5;
    for (lVar11 = 0; lVar11 < iVar3; lVar11 = lVar11 + 1) {
      iVar3 = Vec_IntEntry(pVVar9,(int)lVar11);
      pPars->pTimesReq[lVar11] = (float)iVar3;
      pVVar9 = p->vCoReqs;
      iVar3 = pVVar9->nSize;
    }
  }
  if (p->pCellStr != (char *)0x0) {
    free(p->pCellStr);
    p->pCellStr = (char *)0x0;
  }
  Vec_IntFreeP(&p->vConfigs);
  if ((((((pPars->fDelayOpt == 0) && (pPars->fDelayOptLut == 0)) && (pPars->fDsdBalance == 0)) &&
       ((pPars->fUserRecLib == 0 && (pPars->fUserSesLib == 0)))) &&
      ((pPars->fDeriveLuts == 0 && ((pPars->fUseDsd == 0 && (pPars->fUseTtPerm == 0)))))) &&
     (pPars->pFuncCell2 == (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)) {
    pPars->fCutMin = 0;
  }
  pIfMan = Gia_ManToIf(p,pPars);
  if (pIfMan == (If_Man_t *)0x0) {
    return (Gia_Man_t *)0x0;
  }
  if (pPars->fUseDsd == 0) goto LAB_001f742f;
  pIVar6 = (If_DsdMan_t *)Abc_FrameReadManDsd();
  iVar3 = pPars->nLutSize;
  iVar4 = If_DsdManVarNum(pIVar6);
  if (iVar4 < iVar3) {
    __assert_fail("pPars->nLutSize <= If_DsdManVarNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x908,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  pcVar10 = pPars->pLutStruct;
  if (pcVar10 == (char *)0x0) {
    iVar3 = If_DsdManLutSize(pIVar6);
    if (iVar3 != 0) {
      pcVar10 = pPars->pLutStruct;
      if (pcVar10 == (char *)0x0) goto LAB_001f76d5;
      goto LAB_001f73fb;
    }
  }
  else {
LAB_001f73fb:
    cVar1 = *pcVar10;
    iVar3 = If_DsdManLutSize(pIVar6);
    if (cVar1 + -0x30 != iVar3) {
LAB_001f76d5:
      __assert_fail("(pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - \'0\' == If_DsdManLutSize(p))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x909,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
  }
  pIVar6 = (If_DsdMan_t *)Abc_FrameReadManDsd();
  pIfMan->pIfDsdMan = pIVar6;
  if (pPars->fDsdBalance != 0) {
    If_DsdManAllocIsops(pIVar6,pPars->nLutSize);
  }
LAB_001f742f:
  if (pPars->fPower != 0) {
    if (p->pManTime == (void *)0x0) {
      If_ManComputeSwitching(pIfMan);
    }
    else {
      Abc_Print(0,"Switching activity computation for designs with boxes is disabled.\n");
    }
  }
  if (pPars->pReoMan != (void *)0x0) {
    pIfMan->pUserMan = pPars->pReoMan;
  }
  if ((Tim_Man_t *)p->pManTime != (Tim_Man_t *)0x0) {
    fUnitDelay = 1;
    if ((((pPars->fDelayOpt == 0) && (pPars->fDelayOptLut == 0)) && (pPars->fDsdBalance == 0)) &&
       (pPars->fUserRecLib == 0)) {
      fUnitDelay = (uint)(pPars->fUserSesLib != 0);
    }
    pTVar7 = Tim_ManDup((Tim_Man_t *)p->pManTime,fUnitDelay);
    pIfMan->pManTim = pTVar7;
  }
  pVVar9 = p->vCoAttrs;
  if (pVVar9 != (Vec_Int_t *)0x0) {
    iVar3 = pIfMan->nObjs[3];
    if (iVar3 != pVVar9->nSize) {
      __assert_fail("If_ManCoNum(pIfMan) == Vec_IntSize(p->vCoAttrs)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x91d,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
    }
    for (iVar4 = 0; iVar4 < iVar3; iVar4 = iVar4 + 1) {
      iVar3 = Vec_IntEntry(pVVar9,iVar4);
      pvVar8 = Vec_PtrEntry(pIfMan->vCos,iVar4);
      **(uint **)((long)pvVar8 + 0x18) =
           **(uint **)((long)pvVar8 + 0x18) & 0xfffffbff | (uint)(iVar3 != 0) << 10;
      pVVar9 = p->vCoAttrs;
      iVar3 = pVVar9->nSize;
    }
  }
  iVar3 = If_ManPerformMapping(pIfMan);
  if (iVar3 == 0) {
    If_ManStop(pIfMan);
    return (Gia_Man_t *)0x0;
  }
  if (pPars->pFuncWrite != (_func_int_If_Man_t_ptr *)0x0) {
    (*pPars->pFuncWrite)(pIfMan);
  }
  pIVar2 = pIfMan->pPars;
  if (((pIVar2->fDelayOpt == 0) && (pIVar2->fDsdBalance == 0)) &&
     ((pIVar2->fUserRecLib == 0 && (pIVar2->fUserSesLib == 0)))) {
    p_00 = Gia_ManFromIfLogic(pIfMan);
  }
  else {
    p_00 = Gia_ManFromIfAig(pIfMan);
  }
  if ((p->vCiArrs != (Vec_Int_t *)0x0) || (p->vCoReqs != (Vec_Int_t *)0x0)) {
    Vec_IntFreeP(&p->vCoArrs);
    pVVar9 = Vec_IntAlloc(p->vCos->nSize);
    p->vCoArrs = pVVar9;
    for (iVar3 = 0; iVar3 < pIfMan->vCos->nSize; iVar3 = iVar3 + 1) {
      pvVar8 = Vec_PtrEntry(pIfMan->vCos,iVar3);
      Vec_IntPush(p->vCoArrs,(int)*(float *)(*(long *)((long)pvVar8 + 0x18) + 0x5c));
    }
  }
  If_ManStop(pIfMan);
  if (p_00->pName != (char *)0x0) {
    __assert_fail("pNew->pName == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x937,"Gia_Man_t *Gia_ManPerformMappingInt(Gia_Man_t *, If_Par_t *)");
  }
  pcVar10 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar10;
  if (p_00->pSpec != (char *)0x0) {
    free(p_00->pSpec);
    p_00->pSpec = (char *)0x0;
  }
  pcVar10 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar10;
  Gia_ManSetRegNum(p_00,p->nRegs);
  if (pPars->fVerboseTrace != 0) {
    p_00->pLutLib = pPars->pLutLib;
    Gia_ManDelayTraceLutPrint(p_00,1);
    p_00->pLutLib = (void *)0x0;
    return p_00;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManPerformMappingInt( Gia_Man_t * p, If_Par_t * pPars )
{
    extern void Gia_ManIffTest( Gia_Man_t * pGia, If_LibLut_t * pLib, int fVerbose );
    Gia_Man_t * pNew;
    If_Man_t * pIfMan; int i, Entry;//, Id, EntryF;
    assert( pPars->pTimesArr == NULL );
    assert( pPars->pTimesReq == NULL );
    if ( p->vCiArrs )
    {
        assert( Vec_IntSize(p->vCiArrs) == Gia_ManCiNum(p) );
        pPars->pTimesArr = ABC_CALLOC( float, Gia_ManCiNum(p) );
        Vec_IntForEachEntry( p->vCiArrs, Entry, i )
            pPars->pTimesArr[i] = (float)Entry;
    }
/*  // uncommenting this leads to a mysterious memory corruption 
    else if ( p->vInArrs )
    {
        assert( Vec_FltSize(p->vInArrs) == Gia_ManCiNum(p) );
        pPars->pTimesArr = ABC_CALLOC( float, Gia_ManCiNum(p));
        Gia_ManForEachCiId( p, Id, i )
            pPars->pTimesArr[i] = Vec_FltEntry(p->vInArrs, i);
    }
*/
    if ( p->vCoReqs )
    {
        assert( Vec_IntSize(p->vCoReqs) == Gia_ManCoNum(p) );
        pPars->pTimesReq = ABC_CALLOC( float, Gia_ManCoNum(p) );
        Vec_IntForEachEntry( p->vCoReqs, Entry, i )
            pPars->pTimesReq[i] = (float)Entry;
    }
/*  // uncommenting this leads to a mysterious memory corruption 
    else if ( p->vOutReqs )
    {
        assert( Vec_FltSize(p->vOutReqs) == Gia_ManCoNum(p) );
        pPars->pTimesReq = ABC_CALLOC( float, Gia_ManCoNum(p) );
        Vec_FltForEachEntry( p->vOutReqs, EntryF, i )
            pPars->pTimesReq[i] = EntryF;
    }
*/
    ABC_FREE( p->pCellStr );
    Vec_IntFreeP( &p->vConfigs );
    // disable cut minimization when GIA strucure is needed
    if ( !pPars->fDelayOpt && !pPars->fDelayOptLut && !pPars->fDsdBalance && !pPars->fUserRecLib && !pPars->fUserSesLib && !pPars->fDeriveLuts && !pPars->fUseDsd && !pPars->fUseTtPerm && !pPars->pFuncCell2 )
        pPars->fCutMin = 0;
    // translate into the mapper
    pIfMan = Gia_ManToIf( p, pPars );    
    if ( pIfMan == NULL )
        return NULL;
    // create DSD manager
    if ( pPars->fUseDsd )
    {
        If_DsdMan_t * p = (If_DsdMan_t *)Abc_FrameReadManDsd();
        assert( pPars->nLutSize <= If_DsdManVarNum(p) );
        assert( (pPars->pLutStruct == NULL && If_DsdManLutSize(p) == 0) || (pPars->pLutStruct && pPars->pLutStruct[0] - '0' == If_DsdManLutSize(p)) );
        pIfMan->pIfDsdMan = (If_DsdMan_t *)Abc_FrameReadManDsd();
        if ( pPars->fDsdBalance )
            If_DsdManAllocIsops( pIfMan->pIfDsdMan, pPars->nLutSize );
    }
    // compute switching for the IF objects
    if ( pPars->fPower )
    {
        if ( p->pManTime == NULL )
            If_ManComputeSwitching( pIfMan );
        else
            Abc_Print( 0, "Switching activity computation for designs with boxes is disabled.\n" );
    }
    if ( pPars->pReoMan )
        pIfMan->pUserMan = pPars->pReoMan;
    if ( p->pManTime )
        pIfMan->pManTim = Tim_ManDup( (Tim_Man_t *)p->pManTime, pPars->fDelayOpt || pPars->fDelayOptLut || pPars->fDsdBalance || pPars->fUserRecLib || pPars->fUserSesLib );
//    Tim_ManPrint( pIfMan->pManTim );
    if ( p->vCoAttrs )
    {
        assert( If_ManCoNum(pIfMan) == Vec_IntSize(p->vCoAttrs) );
        Vec_IntForEachEntry( p->vCoAttrs, Entry, i )
            If_ObjFanin0( If_ManCo(pIfMan, i) )->fSpec = (Entry != 0);
    }
    if ( !If_ManPerformMapping( pIfMan ) )
    {
        If_ManStop( pIfMan );
        return NULL;
    }
    if ( pPars->pFuncWrite )
        pPars->pFuncWrite( pIfMan );
    // transform the result of mapping into the new network
    if ( pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib || pIfMan->pPars->fUserSesLib )
        pNew = Gia_ManFromIfAig( pIfMan );
    else
        pNew = Gia_ManFromIfLogic( pIfMan );
    if ( p->vCiArrs || p->vCoReqs )
    {
        If_Obj_t * pIfObj = NULL;
        Vec_IntFreeP( &p->vCoArrs );
        p->vCoArrs = Vec_IntAlloc( Gia_ManCoNum(p) );
        If_ManForEachCo( pIfMan, pIfObj, i )
            Vec_IntPush( p->vCoArrs, (int)If_ObjArrTime(If_ObjFanin0(pIfObj)) );
    }
    If_ManStop( pIfMan );
    // transfer name
    assert( pNew->pName == NULL );
    pNew->pName = Abc_UtilStrsav( p->pName );
    ABC_FREE( pNew->pSpec );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // print delay trace
    if ( pPars->fVerboseTrace )
    {
        pNew->pLutLib = pPars->pLutLib;
        Gia_ManDelayTraceLutPrint( pNew, 1 );
        pNew->pLutLib = NULL;
    }
    return pNew;
}